

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3833::EvaluateSectionPoint
          (ChElementShellANCF_3833 *this,double xi,double eta,ChVector<double> *point)

{
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_390;
  VectorN *local_388;
  VectorN local_380;
  Matrix3xN local_2c0;
  
  Calc_Sxi_compact(this,&local_380,xi,eta,0.0,this->m_thicknessZ,this->m_midsurfoffset);
  CalcCoordMatrix(this,&local_2c0);
  local_390 = &local_2c0;
  local_388 = &local_380;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_24,_1,_3,_24>,_Eigen::Matrix<double,_24,_1,_0,_24,_1>,_0>_>
                    *)&local_390);
  return;
}

Assistant:

void ChElementShellANCF_3833::EvaluateSectionPoint(const double xi, const double eta, ChVector<>& point) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, 0, m_thicknessZ, m_midsurfoffset);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;
}